

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void int_init(void)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  sigaction timer_action;
  itimerval timert;
  
  timer_action.__sigaction_handler.sa_handler = int_timer_service;
  sigemptyset((sigset_t *)&timer_action.sa_mask);
  timer_action.sa_flags = 0x10000000;
  iVar1 = sigaction(0x1a,(sigaction *)&timer_action,(sigaction *)0x0);
  if (iVar1 == -1) {
    perror("sigaction: SIGVTALRM");
  }
  timert.it_value.tv_sec = 0;
  timert.it_interval.tv_sec = 0;
  timert.it_interval.tv_usec = (__suseconds_t)TIMER_INTERVAL;
  timert.it_value.tv_usec = timert.it_interval.tv_usec;
  setitimer(ITIMER_VIRTUAL,(itimerval *)&timert,(itimerval *)0x0);
  timer_action.__sigaction_handler.sa_handler = int_io_service;
  sigemptyset((sigset_t *)&timer_action.sa_mask);
  timer_action.sa_flags = 0;
  iVar1 = sigaction(0x1d,(sigaction *)&timer_action,(sigaction *)0x0);
  if (iVar1 == -1) {
    perror("sigaction: SIGIO");
  }
  timer_action.__sigaction_handler.sa_handler = timeout_error;
  sigemptyset((sigset_t *)&timer_action.sa_mask);
  timer_action.sa_flags = 0;
  iVar1 = sigaction(0xe,(sigaction *)&timer_action,(sigaction *)0x0);
  if (iVar1 == -1) {
    perror("sigaction: SIGALRM");
  }
  __nptr = getenv("LDEFILETIMEOUT");
  if (__nptr != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(__nptr,(char **)0x0,10);
    if (0 < (int)(uint)lVar3 && *piVar2 == 0) {
      TIMEOUT_TIME = (uint)lVar3;
    }
  }
  timer_action.__sigaction_handler.sa_handler = panicuraid;
  sigemptyset((sigset_t *)&timer_action.sa_mask);
  timer_action.sa_flags = 4;
  timert.it_interval.tv_sec = 1;
  sigemptyset((sigset_t *)&timert.it_interval.tv_usec);
  sigaction(1,(sigaction *)&timer_action,(sigaction *)0x0);
  sigaction(3,(sigaction *)&timer_action,(sigaction *)0x0);
  sigaction(4,(sigaction *)&timer_action,(sigaction *)0x0);
  sigaction(7,(sigaction *)&timer_action,(sigaction *)0x0);
  sigaction(0xb,(sigaction *)&timer_action,(sigaction *)0x0);
  sigaction(0x1f,(sigaction *)&timer_action,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&timer_action,(sigaction *)0x0);
  sigaction(0xd,(sigaction *)&timert,(sigaction *)0x0);
  int_unblock();
  return;
}

Assistant:

static void int_timer_init(void)

{
#ifdef DOS
  /******************************************************************************
  *  All code and data touched during the processing of an interrupt should
  *  locked prior to receiving any interrupts.  This prevents the Timer
  *  function from being swapped out during an interrupt.
  ******************************************************************************/
  _dpmi_lockregion((void *)Irq_Stk_End, sizeof(Irq_Stk_End));
  _dpmi_lockregion((void *)Irq_Stk_Check, sizeof(Irq_Stk_Check));
  _dpmi_lockregion((void *)tick_count, sizeof(tick_count));
  _dpmi_lockregion((void *)&DOStimer, 4096);
  _dpmi_lockregion((void *)prev_int_1c, sizeof(prev_int_1c));

  /* Set up the DOS time handler. */
  prev_int_1c = _dos_getvect(0x1c); /* get addr of current 1c hndlr, */
                                    /* if any*/
  _dos_setvect(0x1c, DOStimer);     /* hook our int handler to timer int */

#else
  struct itimerval timert;
  struct sigaction timer_action;

  timer_action.sa_handler = int_timer_service;
  sigemptyset(&timer_action.sa_mask);
  timer_action.sa_flags = SA_RESTART;

  if (sigaction(SIGVTALRM, &timer_action, NULL) == -1) {
    perror("sigaction: SIGVTALRM");
  }

  /* then attach a timer to it and turn it loose */
  timert.it_interval.tv_sec = timert.it_value.tv_sec = 0;
  timert.it_interval.tv_usec = timert.it_value.tv_usec = TIMER_INTERVAL;
  setitimer(ITIMER_VIRTUAL, &timert, NULL);

  DBPRINT(("Timer interval set to %ld usec\n", (long)timert.it_value.tv_usec));
#endif /* DOS */
}